

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 454.test.cpp
# Opt level: O2

void verifyChunkWithEnergyIndependentYields(Type<8,_454> *chunk)

{
  vector<double,_std::allocator<double>_> *this;
  int iVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  range_reference_t<D<true>_>_conflict2 pdVar5;
  long lVar6;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  AssertionHandler catchAssertionHandler_14;
  undefined1 local_138 [8];
  undefined8 local_130;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_128;
  undefined1 local_120 [8];
  int local_118;
  undefined4 uStack_114;
  double local_100;
  MatchExpr<int,_Catch::Matchers::WithinRelMatcher> local_f8;
  undefined1 local_d8 [8];
  bool local_d0;
  bool bStack_cf;
  undefined2 uStack_ce;
  undefined4 uStack_cc;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_c8;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  local_c0;
  undefined8 local_b8;
  Type<8,_454> *local_a0;
  FissionYieldData data;
  range_reference_t<D<true>_> local_50;
  
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x1fd;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "454 == chunk.MT()";
  local_a0 = chunk;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression,ContinueOnFailure);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT62(catchAssertionHandler_14.m_assertionInfo.macroName.m_size._2_6_,0x101);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1c6,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start._4_4_,
                        0x1c6);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x1fe;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "454 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_00,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_00,ContinueOnFailure);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT62(catchAssertionHandler_14.m_assertionInfo.macroName.m_size._2_6_,0x101);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1c6,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start._4_4_,
                        0x1c6);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x200;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "92235 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_01,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_01,ContinueOnFailure);
  iVar1 = (local_a0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).ZA_;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar1 == 0x1684b,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1684b,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x201;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "92235 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_02,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_02,ContinueOnFailure);
  iVar1 = (local_a0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).ZA_;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar1 == 0x1684b,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4230;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(0x1684b,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x202;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x22;
  capturedExpression_03.m_start = "233.0250, WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_03,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_03,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x406d20cccccccccd;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_14,
             (local_a0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).
             atomicWeightRatio_);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_14,(double *)local_d8);
  local_130._1_1_ = bVar4;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_14;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x203;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x30;
  capturedExpression_04.m_start = "233.0250, WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_04,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_04,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x406d20cccccccccd;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_14,
             (local_a0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).
             atomicWeightRatio_);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_14,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_14;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x205;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x12;
  capturedExpression_05.m_start = "true == chunk.LE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_05,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_05,ContinueOnFailure);
  sVar2 = catchAssertionHandler_14.m_assertionInfo.macroName.m_size;
  bVar4 = (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(bVar4,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start = "&\x16\x14";
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._3_5_ = SUB85(sVar2,3);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_3_ =
       CONCAT12(1,(undefined2)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT71(catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start._1_7_,
                        bVar4);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x206;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x23;
  capturedExpression_06.m_start = "true == chunk.isEnergyIndependent()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_06,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_06,ContinueOnFailure);
  sVar2 = catchAssertionHandler_14.m_assertionInfo.macroName.m_size;
  bVar4 = (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(bVar4,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start = "&\x16\x14";
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._3_5_ = SUB85(sVar2,3);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_3_ =
       CONCAT12(1,(undefined2)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT71(catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start._1_7_,
                        bVar4);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x208;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0xf;
  capturedExpression_07.m_start = "1 == chunk.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_07,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_07,ContinueOnFailure);
  lVar6 = (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x48,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start = "$\x17\x14";
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x209;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x15;
  capturedExpression_08.m_start = "1 == chunk.E().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_08,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_08,ContinueOnFailure);
  lVar6 = (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x48,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4330;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x20a;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x24;
  capturedExpression_09.m_start = "1 == chunk.incidentEnergies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_09,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_09,ContinueOnFailure);
  lVar6 = (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x48,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4330;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x20b;
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  capturedExpression_10.m_size = 0x1d;
  capturedExpression_10.m_start = "0., WithinRel( chunk.E()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_10,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_10,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_14,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(((local_a0->data_).
                       super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x28))->_M_head_impl);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_14,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_14;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x20c;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x2c;
  capturedExpression_11.m_start = "0., WithinRel( chunk.incidentEnergies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_11,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_11,ContinueOnFailure);
  local_d8 = (undefined1  [8])0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_14,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(((local_a0->data_).
                       super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x28))->_M_head_impl);
  local_130._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_14,(double *)local_d8);
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_128._M_current = (double *)local_d8;
  local_120 = (undefined1  [8])&catchAssertionHandler_14;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&data,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/454/test/454.test.cpp"
  ;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size = 0x20e;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x1a;
  capturedExpression_12.m_start = "1 == chunk.yields().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&data,macroName_12,(SourceLineInfo *)&catchAssertionHandler_14,
             capturedExpression_12,ContinueOnFailure);
  lVar6 = (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_14.m_assertionInfo.capturedExpression.m_start = (char *)(lVar6 / 0x48);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar6 == 0x48,1);
  catchAssertionHandler_14.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001e4330;
  catchAssertionHandler_14.m_assertionInfo.macroName.m_size =
       CONCAT44(1,(undefined4)catchAssertionHandler_14.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_14.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_14.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&data,(ITransientExpression *)&catchAssertionHandler_14);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_14);
  Catch::AssertionHandler::complete((AssertionHandler *)&data);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&data);
  njoy::ENDFtk::ListRecord::ListRecord
            (&data.super_ListRecord,
             &((local_a0->data_).
               super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x211;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0xd;
  capturedExpression_13.m_start = "0 == data.I()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_13,(SourceLineInfo *)local_138,
             capturedExpression_13,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x212;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x1d;
  capturedExpression_14.m_start = "0 == data.interpolationType()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_14,(SourceLineInfo *)local_138,
             capturedExpression_14,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)data.super_ListRecord.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>
                   ._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x213;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x11;
  capturedExpression_15.m_start = "true == data.LE()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_15,(SourceLineInfo *)local_138,
             capturedExpression_15,ContinueOnFailure);
  _Var3._M_p = local_130;
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42b0;
  local_130._3_5_ = SUB85(_Var3._M_p,3);
  local_130._2_1_ = 1;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118._0_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x214;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x22;
  capturedExpression_16.m_start = "true == data.isEnergyIndependent()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_16,(SourceLineInfo *)local_138,
             capturedExpression_16,ContinueOnFailure);
  _Var3._M_p = local_130;
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42b0;
  local_130._3_5_ = SUB85(_Var3._M_p,3);
  local_130._2_1_ = 1;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118._0_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x215;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0xf;
  capturedExpression_17.m_start = "3 == data.NFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_17,(SourceLineInfo *)local_138,
             capturedExpression_17,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
            super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x216;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x21;
  capturedExpression_18.m_start = "3 == data.numberFissionProducts()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_18,(SourceLineInfo *)local_138,
             capturedExpression_18,ContinueOnFailure);
  local_130._1_1_ =
       (int)data.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
            super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4230;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)data.super_ListRecord.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                   super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x217;
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  capturedExpression_19.m_size = 0x19;
  capturedExpression_19.m_start = "0., WithinRel( data.E() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_19,(SourceLineInfo *)local_138,
             capturedExpression_19,ContinueOnFailure);
  local_f8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             data.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_cf = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_138,(double *)&local_f8);
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_c8._M_current = (double *)&local_f8;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_138;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x218;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x26;
  capturedExpression_20.m_start = "0., WithinRel( data.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_20,(SourceLineInfo *)local_138,
             capturedExpression_20,ContinueOnFailure);
  local_f8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             data.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_cf = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_138,(double *)&local_f8);
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4270;
  local_c8._M_current = (double *)&local_f8;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_138;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x21a;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x22;
  capturedExpression_21.m_start = "3 == data.fissionProducts().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_21,(SourceLineInfo *)local_138,
             capturedExpression_21,ContinueOnFailure);
  this = &data.super_ListRecord.data;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  _local_118 = ranges::
               chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
               size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x21b;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x29;
  capturedExpression_22.m_start = "23066 == data.fissionProducts()[0].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_22,(SourceLineInfo *)local_138,
             capturedExpression_22,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_130._1_1_ = (int)(long)*(double *)local_f8.m_arg == 0x5a1a;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x21c;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x29;
  capturedExpression_23.m_start = "54135 == data.fissionProducts()[1].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_23,(SourceLineInfo *)local_138,
             capturedExpression_23,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0xd377;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x21d;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x29;
  capturedExpression_24.m_start = "72171 == data.fissionProducts()[2].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_24,(SourceLineInfo *)local_138,
             capturedExpression_24,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x119eb;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x21e;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x3d;
  capturedExpression_25.m_start = "23066 == data.fissionProducts()[0].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_25,(SourceLineInfo *)local_138,
             capturedExpression_25,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x5a1a;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x21f;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x3d;
  capturedExpression_26.m_start = "54135 == data.fissionProducts()[1].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_26,(SourceLineInfo *)local_138,
             capturedExpression_26,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0xd377;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x220;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0x3d;
  capturedExpression_27.m_start = "72171 == data.fissionProducts()[2].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_27,(SourceLineInfo *)local_138,
             capturedExpression_27,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)local_f8.m_arg;
  local_130._1_1_ = local_118 == 0x119eb;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x221;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x24;
  capturedExpression_28.m_start = "0 == data.fissionProducts()[0].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_28,(SourceLineInfo *)local_138,
             capturedExpression_28,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x222;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0x24;
  capturedExpression_29.m_start = "0 == data.fissionProducts()[1].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_29,(SourceLineInfo *)local_138,
             capturedExpression_29,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x223;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x24;
  capturedExpression_30.m_start = "0 == data.fissionProducts()[2].FPS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_30,(SourceLineInfo *)local_138,
             capturedExpression_30,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x224;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x2e;
  capturedExpression_31.m_start = "0 == data.fissionProducts()[0].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_31,(SourceLineInfo *)local_138,
             capturedExpression_31,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x225;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x2e;
  capturedExpression_32.m_start = "0 == data.fissionProducts()[1].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_32,(SourceLineInfo *)local_138,
             capturedExpression_32,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  local_130._1_1_ = local_118 == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x226;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x2e;
  capturedExpression_33.m_start = "0 == data.fissionProducts()[2].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_33,(SourceLineInfo *)local_138,
             capturedExpression_33,ContinueOnFailure);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_f8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  local_130._1_1_ = (int)(long)*(double *)((long)local_f8.m_arg + 8) == 0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4370;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  local_118 = (int)(long)*(double *)((long)local_f8.m_arg + 8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x227;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x3a;
  capturedExpression_34.m_start = "2.05032e-19, WithinRel( data.fissionProducts()[0].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_34,(SourceLineInfo *)local_138,
             capturedExpression_34,ContinueOnFailure);
  local_100 = 2.05032e-19;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x228;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x3a;
  capturedExpression_35.m_start = "1.31220e-19, WithinRel( data.fissionProducts()[0].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_35,(SourceLineInfo *)local_138,
             capturedExpression_35,ContinueOnFailure);
  local_100 = 1.3122e-19;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x229;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x3a;
  capturedExpression_36.m_start = "7.851250e-4, WithinRel( data.fissionProducts()[1].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_36,(SourceLineInfo *)local_138,
             capturedExpression_36,ContinueOnFailure);
  local_100 = 0.000785125;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x22a;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x3a;
  capturedExpression_37.m_start = "4.710750e-5, WithinRel( data.fissionProducts()[1].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_37,(SourceLineInfo *)local_138,
             capturedExpression_37,ContinueOnFailure);
  local_100 = 4.71075e-05;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x22b;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x30;
  capturedExpression_38.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_38,(SourceLineInfo *)local_138,
             capturedExpression_38,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x10));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x22c;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x30;
  capturedExpression_39.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_39,(SourceLineInfo *)local_138,
             capturedExpression_39,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4;
  local_b8._0_2_ = CONCAT11(1,(undefined1)local_b8);
  local_c8._M_current = (double *)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/FissionYieldData.hpp:134:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)&local_50,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_8_FissionYieldData_hpp:134:20)>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 0x18));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x22e;
  macroName_40.m_size = 5;
  macroName_40.m_start = "CHECK";
  capturedExpression_40.m_size = 0x17;
  capturedExpression_40.m_start = "3 == data.ZAFP().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_40,(SourceLineInfo *)local_138,
             capturedExpression_40,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x22f;
  macroName_41.m_size = 5;
  macroName_41.m_start = "CHECK";
  capturedExpression_41.m_size = 0x2c;
  capturedExpression_41.m_start = "3 == data.fissionProductIdentifiers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_41,(SourceLineInfo *)local_138,
             capturedExpression_41,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x230;
  macroName_42.m_size = 5;
  macroName_42.m_start = "CHECK";
  capturedExpression_42.m_size = 0x16;
  capturedExpression_42.m_start = "3 == data.FPS().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_42,(SourceLineInfo *)local_138,
             capturedExpression_42,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x231;
  macroName_43.m_size = 5;
  macroName_43.m_start = "CHECK";
  capturedExpression_43.m_size = 0x21;
  capturedExpression_43.m_start = "3 == data.isomericStates().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_43,(SourceLineInfo *)local_138,
             capturedExpression_43,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  _local_118 = (((CONCAT44(uStack_cc,CONCAT22(uStack_ce,CONCAT11(bStack_cf,local_d0))) -
                  (long)local_c8._M_current >> 3) + (long)local_c0._M_head_impl._M_current) - 1U) /
               (ulong)local_c0._M_head_impl._M_current;
  local_130._1_1_ = _local_118 == 3;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  local_130._4_4_ = 3;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x232;
  macroName_44.m_size = 5;
  macroName_44.m_start = "CHECK";
  capturedExpression_44.m_size = 0x14;
  capturedExpression_44.m_start = "3 == data.Y().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_44,(SourceLineInfo *)local_138,
             capturedExpression_44,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  local_b8 = (WithinRelMatcher *)
             ranges::
             stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
             ::size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                       ((stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
                         *)local_138);
  bStack_cf = local_b8 == (WithinRelMatcher *)0x3;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 3;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x233;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0x20;
  capturedExpression_45.m_start = "3 == data.fissionYields().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_45,(SourceLineInfo *)local_138,
             capturedExpression_45,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  local_b8 = (WithinRelMatcher *)
             ranges::
             stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
             ::size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                       ((stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
                         *)local_138);
  bStack_cf = local_b8 == (WithinRelMatcher *)0x3;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 3;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x234;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x17;
  capturedExpression_46.m_start = "23066 == data.ZAFP()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_46,(SourceLineInfo *)local_138,
             capturedExpression_46,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 23066.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x235;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0x17;
  capturedExpression_47.m_start = "54135 == data.ZAFP()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_47,(SourceLineInfo *)local_138,
             capturedExpression_47,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 54135.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x236;
  macroName_48.m_size = 5;
  macroName_48.m_start = "CHECK";
  capturedExpression_48.m_size = 0x17;
  capturedExpression_48.m_start = "72171 == data.ZAFP()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_48,(SourceLineInfo *)local_138,
             capturedExpression_48,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 72171.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x237;
  macroName_49.m_size = 5;
  macroName_49.m_start = "CHECK";
  capturedExpression_49.m_size = 0x2c;
  capturedExpression_49.m_start = "23066 == data.fissionProductIdentifiers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_49,(SourceLineInfo *)local_138,
             capturedExpression_49,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 23066.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x5a1a;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x238;
  macroName_50.m_size = 5;
  macroName_50.m_start = "CHECK";
  capturedExpression_50.m_size = 0x2c;
  capturedExpression_50.m_start = "54135 == data.fissionProductIdentifiers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_50,(SourceLineInfo *)local_138,
             capturedExpression_50,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 54135.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0xd377;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x239;
  macroName_51.m_size = 5;
  macroName_51.m_start = "CHECK";
  capturedExpression_51.m_size = 0x2c;
  capturedExpression_51.m_start = "72171 == data.fissionProductIdentifiers()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_51,(SourceLineInfo *)local_138,
             capturedExpression_51,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::ZAFP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 72171.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130._4_4_ = 0x119eb;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x23a;
  macroName_52.m_size = 5;
  macroName_52.m_start = "CHECK";
  capturedExpression_52.m_size = 0x12;
  capturedExpression_52.m_start = "0 == data.FPS()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_52,(SourceLineInfo *)local_138,
             capturedExpression_52,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x23b;
  macroName_53.m_size = 5;
  macroName_53.m_start = "CHECK";
  capturedExpression_53.m_size = 0x12;
  capturedExpression_53.m_start = "0 == data.FPS()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_53,(SourceLineInfo *)local_138,
             capturedExpression_53,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x23c;
  macroName_54.m_size = 5;
  macroName_54.m_start = "CHECK";
  capturedExpression_54.m_size = 0x12;
  capturedExpression_54.m_start = "0 == data.FPS()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_54,(SourceLineInfo *)local_138,
             capturedExpression_54,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x23d;
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  capturedExpression_55.m_size = 0x1d;
  capturedExpression_55.m_start = "0 == data.isomericStates()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_55,(SourceLineInfo *)local_138,
             capturedExpression_55,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,0);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x23e;
  macroName_56.m_size = 5;
  macroName_56.m_start = "CHECK";
  capturedExpression_56.m_size = 0x1d;
  capturedExpression_56.m_start = "0 == data.isomericStates()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_56,(SourceLineInfo *)local_138,
             capturedExpression_56,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,1);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x23f;
  macroName_57.m_size = 5;
  macroName_57.m_start = "CHECK";
  capturedExpression_57.m_size = 0x1d;
  capturedExpression_57.m_start = "0 == data.isomericStates()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_57,(SourceLineInfo *)local_138,
             capturedExpression_57,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::FPS
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_d8,&data);
  pdVar5 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_d8,2);
  _local_118 = *pdVar5;
  local_130._1_1_ = (double)_local_118 == 0.0;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e43f0;
  local_130 = local_130 & 0xffffffff;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x240;
  macroName_58.m_size = 5;
  macroName_58.m_start = "CHECK";
  capturedExpression_58.m_size = 0x17;
  capturedExpression_58.m_start = "2 == data.Y()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_58,(SourceLineInfo *)local_138,
             capturedExpression_58,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,0);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x241;
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  capturedExpression_59.m_size = 0x17;
  capturedExpression_59.m_start = "2 == data.Y()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_59,(SourceLineInfo *)local_138,
             capturedExpression_59,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,1);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x242;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x17;
  capturedExpression_60.m_start = "2 == data.Y()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_60,(SourceLineInfo *)local_138,
             capturedExpression_60,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,2);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x243;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x23;
  capturedExpression_61.m_start = "2 == data.fissionYields()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_61,(SourceLineInfo *)local_138,
             capturedExpression_61,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,0);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x244;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x23;
  capturedExpression_62.m_start = "2 == data.fissionYields()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_62,(SourceLineInfo *)local_138,
             capturedExpression_62,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,1);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x245;
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  capturedExpression_63.m_size = 0x23;
  capturedExpression_63.m_start = "2 == data.fissionYields()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_63,(SourceLineInfo *)local_138,
             capturedExpression_63,ContinueOnFailure);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_138,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_> *)&local_f8,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_138,2);
  local_b8 = (WithinRelMatcher *)
             (CONCAT62(local_f8.super_ITransientExpression._10_6_,
                       CONCAT11(local_f8.super_ITransientExpression.m_result,
                                local_f8.super_ITransientExpression.m_isBinaryExpression)) -
              (long)local_f8.m_arg >> 3);
  if (local_f8.m_matcher < local_b8) {
    local_b8 = local_f8.m_matcher;
  }
  bStack_cf = local_b8 == (WithinRelMatcher *)0x2;
  local_d0 = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001e4330;
  uStack_cc = 2;
  local_c8._M_current = (double *)0x1935ad;
  local_c0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x246;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x28;
  capturedExpression_64.m_start = "2.05032e-19, WithinRel( data.Y()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_64,(SourceLineInfo *)local_138,
             capturedExpression_64,ContinueOnFailure);
  local_100 = 2.05032e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x247;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x28;
  capturedExpression_65.m_start = "1.31220e-19, WithinRel( data.Y()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_65,(SourceLineInfo *)local_138,
             capturedExpression_65,ContinueOnFailure);
  local_100 = 1.3122e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x248;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x28;
  capturedExpression_66.m_start = "7.851250e-4, WithinRel( data.Y()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_66,(SourceLineInfo *)local_138,
             capturedExpression_66,ContinueOnFailure);
  local_100 = 0.000785125;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x249;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x28;
  capturedExpression_67.m_start = "4.710750e-5, WithinRel( data.Y()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_67,(SourceLineInfo *)local_138,
             capturedExpression_67,ContinueOnFailure);
  local_100 = 4.71075e-05;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x24a;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x1e;
  capturedExpression_68.m_start = "0, WithinRel( data.Y()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_68,(SourceLineInfo *)local_138,
             capturedExpression_68,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x24b;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x1e;
  capturedExpression_69.m_start = "0, WithinRel( data.Y()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_69,(SourceLineInfo *)local_138,
             capturedExpression_69,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x24c;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x34;
  capturedExpression_70.m_start = "2.05032e-19, WithinRel( data.fissionYields()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_70,(SourceLineInfo *)local_138,
             capturedExpression_70,ContinueOnFailure);
  local_100 = 2.05032e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x24d;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x34;
  capturedExpression_71.m_start = "1.31220e-19, WithinRel( data.fissionYields()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_71,(SourceLineInfo *)local_138,
             capturedExpression_71,ContinueOnFailure);
  local_100 = 1.3122e-19;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x24e;
  macroName_72.m_size = 10;
  macroName_72.m_start = "CHECK_THAT";
  capturedExpression_72.m_size = 0x34;
  capturedExpression_72.m_start = "7.851250e-4, WithinRel( data.fissionYields()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_72,(SourceLineInfo *)local_138,
             capturedExpression_72,ContinueOnFailure);
  local_100 = 0.000785125;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x24f;
  macroName_73.m_size = 10;
  macroName_73.m_start = "CHECK_THAT";
  capturedExpression_73.m_size = 0x34;
  capturedExpression_73.m_start = "4.710750e-5, WithinRel( data.fissionYields()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_73,(SourceLineInfo *)local_138,
             capturedExpression_73,ContinueOnFailure);
  local_100 = 4.71075e-05;
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_f8.super_ITransientExpression.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_138,&local_100);
  local_f8.super_ITransientExpression.m_isBinaryExpression = true;
  local_f8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001e4270;
  local_f8.m_arg = (int *)&local_100;
  local_f8.m_matcher = (WithinRelMatcher *)local_138;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x250;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x2a;
  capturedExpression_74.m_start = "0, WithinRel( data.fissionYields()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_74,(SourceLineInfo *)local_138,
             capturedExpression_74,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x251;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x2a;
  capturedExpression_75.m_start = "0, WithinRel( data.fissionYields()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_75,(SourceLineInfo *)local_138,
             capturedExpression_75,ContinueOnFailure);
  local_100 = (double)((ulong)local_100 & 0xffffffff00000000);
  njoy::ENDFtk::section::FissionYieldData::Y
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_int>
              *)local_d8,&data);
  ranges::
  view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>_>,_(ranges::cardinality)_1>
              *)local_d8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_138,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  Catch::MatchExpr<int,_Catch::Matchers::WithinRelMatcher>::MatchExpr
            (&local_f8,(int *)&local_100,(WithinRelMatcher *)local_138);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_14,&local_f8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_f8.super_ITransientExpression);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  local_138 = (undefined1  [8])0x1914b4;
  local_130 = (pointer)0x253;
  macroName_76.m_size = 5;
  macroName_76.m_start = "CHECK";
  capturedExpression_76.m_size = 0xf;
  capturedExpression_76.m_start = "4 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_14,macroName_76,(SourceLineInfo *)local_138,
             capturedExpression_76,ContinueOnFailure);
  _local_118 = njoy::ENDFtk::section::Type<8,_454>::NC(local_a0);
  local_130._1_1_ = _local_118 == 4;
  local_130._0_1_ = true;
  local_138 = (undefined1  [8])&PTR_streamReconstructedExpression_001e42f0;
  local_130._4_4_ = 4;
  local_128._M_current = (double *)0x1935ad;
  local_120 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_14,(ITransientExpression *)local_138);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete(&catchAssertionHandler_14);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_14);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&this->super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void verifyChunkWithEnergyIndependentYields( const section::Type< 8, 454 >& chunk ) {

  CHECK( 454 == chunk.MT() );
  CHECK( 454 == chunk.sectionNumber() );

  CHECK( 92235 == chunk.ZA() );
  CHECK( 92235 == chunk.targetIdentifier() );
  CHECK_THAT( 233.0250, WithinRel( chunk.AWR() ) );
  CHECK_THAT( 233.0250, WithinRel( chunk.atomicWeightRatio() ) );

  CHECK( true == chunk.LE() );
  CHECK( true == chunk.isEnergyIndependent() );

  CHECK( 1 == chunk.NE() );
  CHECK( 1 == chunk.E().size() );
  CHECK( 1 == chunk.incidentEnergies().size() );
  CHECK_THAT( 0., WithinRel( chunk.E()[0] ) );
  CHECK_THAT( 0., WithinRel( chunk.incidentEnergies()[0] ) );

  CHECK( 1 == chunk.yields().size() );

  auto data = chunk.yields()[0];
  CHECK( 0 == data.I() );
  CHECK( 0 == data.interpolationType() );
  CHECK( true == data.LE() );
  CHECK( true == data.isEnergyIndependent() );
  CHECK( 3 == data.NFP() );
  CHECK( 3 == data.numberFissionProducts() );
  CHECK_THAT( 0., WithinRel( data.E() ) );
  CHECK_THAT( 0., WithinRel( data.incidentEnergy() ) );

  CHECK( 3 == data.fissionProducts().size() );
  CHECK( 23066 == data.fissionProducts()[0].ZAFP() );
  CHECK( 54135 == data.fissionProducts()[1].ZAFP() );
  CHECK( 72171 == data.fissionProducts()[2].ZAFP() );
  CHECK( 23066 == data.fissionProducts()[0].fissionProductIdentifier() );
  CHECK( 54135 == data.fissionProducts()[1].fissionProductIdentifier() );
  CHECK( 72171 == data.fissionProducts()[2].fissionProductIdentifier() );
  CHECK( 0 == data.fissionProducts()[0].FPS() );
  CHECK( 0 == data.fissionProducts()[1].FPS() );
  CHECK( 0 == data.fissionProducts()[2].FPS() );
  CHECK( 0 == data.fissionProducts()[0].isomericState() );
  CHECK( 0 == data.fissionProducts()[1].isomericState() );
  CHECK( 0 == data.fissionProducts()[2].isomericState() );
  CHECK_THAT( 2.05032e-19, WithinRel( data.fissionProducts()[0].Y()[0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.fissionProducts()[0].Y()[1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.fissionProducts()[1].Y()[0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.fissionProducts()[1].Y()[1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[1] ) );

  CHECK( 3 == data.ZAFP().size() );
  CHECK( 3 == data.fissionProductIdentifiers().size() );
  CHECK( 3 == data.FPS().size() );
  CHECK( 3 == data.isomericStates().size() );
  CHECK( 3 == data.Y().size() );
  CHECK( 3 == data.fissionYields().size() );
  CHECK( 23066 == data.ZAFP()[0] );
  CHECK( 54135 == data.ZAFP()[1] );
  CHECK( 72171 == data.ZAFP()[2] );
  CHECK( 23066 == data.fissionProductIdentifiers()[0] );
  CHECK( 54135 == data.fissionProductIdentifiers()[1] );
  CHECK( 72171 == data.fissionProductIdentifiers()[2] );
  CHECK( 0 == data.FPS()[0] );
  CHECK( 0 == data.FPS()[1] );
  CHECK( 0 == data.FPS()[2] );
  CHECK( 0 == data.isomericStates()[0] );
  CHECK( 0 == data.isomericStates()[1] );
  CHECK( 0 == data.isomericStates()[2] );
  CHECK( 2 == data.Y()[0].size() );
  CHECK( 2 == data.Y()[1].size() );
  CHECK( 2 == data.Y()[2].size() );
  CHECK( 2 == data.fissionYields()[0].size() );
  CHECK( 2 == data.fissionYields()[1].size() );
  CHECK( 2 == data.fissionYields()[2].size() );
  CHECK_THAT( 2.05032e-19, WithinRel( data.Y()[0][0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.Y()[0][1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.Y()[1][0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.Y()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][1] ) );
  CHECK_THAT( 2.05032e-19, WithinRel( data.fissionYields()[0][0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.fissionYields()[0][1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.fissionYields()[1][0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.fissionYields()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][1] ) );

  CHECK( 4 == chunk.NC() );
}